

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
llvm::SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>::
insert(SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
       *this,iterator I,unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *Elt)

{
  uint uVar1;
  void *pvVar2;
  reference puVar3;
  ulong uVar4;
  long lVar5;
  iterator puVar6;
  
  puVar6 = (iterator)
           (this->
           super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
           ).
           super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
           .super_SmallVectorBase.BeginX;
  uVar1 = (this->
          super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
          ).
          super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
          .super_SmallVectorBase.Size;
  uVar4 = (ulong)uVar1;
  if (puVar6 + uVar4 == I) {
    SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
    ::push_back(&this->
                 super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                ,Elt);
    I = (iterator)
        ((long)(this->
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               ).
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.BeginX +
        (ulong)(this->
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               ).
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.Size * 8 + -8);
  }
  else {
    if (I < puVar6) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x1d9,
                    "iterator llvm::SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit>>::insert(iterator, T &&) [T = std::unique_ptr<llvm::DWARFUnit>]"
                   );
    }
    if (puVar6 + uVar4 < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x1da,
                    "iterator llvm::SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit>>::insert(iterator, T &&) [T = std::unique_ptr<llvm::DWARFUnit>]"
                   );
    }
    if ((this->
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        ).
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Capacity <= uVar1) {
      lVar5 = (long)I - (long)puVar6;
      SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
      ::grow(&this->
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             ,0);
      puVar6 = (iterator)
               (this->
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               ).
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.BeginX;
      I = (iterator)(lVar5 + (long)puVar6);
      uVar4 = (ulong)(this->
                     super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                     .super_SmallVectorBase.Size;
    }
    puVar3 = SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             ::back((SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                     *)this);
    puVar6[uVar4]._M_t.super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
    ._M_t.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
    super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
         (puVar3->_M_t).
         super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
         super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
         super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
    (puVar3->_M_t).super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
    _M_t.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
    super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl = (DWARFUnit *)0x0;
    pvVar2 = (this->
             super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             ).
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             .super_SmallVectorBase.BeginX;
    uVar4 = (ulong)(this->
                   super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                   ).
                   super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                   .super_SmallVectorBase.Size;
    std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
    __copy_move_b<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*,std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>
              (I,(unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                 ((long)pvVar2 + uVar4 * 8 + -8),
               (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
               ((long)pvVar2 + uVar4 * 8));
    SmallVectorBase::set_size
              ((SmallVectorBase *)this,
               (ulong)(this->
                      super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                      .super_SmallVectorBase.Size + 1);
    lVar5 = 0;
    if (I <= Elt) {
      lVar5 = (ulong)(Elt < (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                            ((ulong)(this->
                                    super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                                    ).
                                    super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                                    .super_SmallVectorBase.Size * 8 +
                            (long)(this->
                                  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                                  ).
                                  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                                  .super_SmallVectorBase.BeginX)) << 3;
    }
    std::__uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator=
              ((__uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)I,
               (__uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
               ((long)&(Elt->_M_t).
                       super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                       .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl + lVar5));
  }
  return (iterator)(__uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)I;
}

Assistant:

iterator insert(iterator I, T &&Elt) {
    if (I == this->end()) {  // Important special case for empty vector.
      this->push_back(::std::move(Elt));
      return this->end()-1;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    if (this->size() >= this->capacity()) {
      size_t EltNo = I-this->begin();
      this->grow();
      I = this->begin()+EltNo;
    }

    ::new ((void*) this->end()) T(::std::move(this->back()));
    // Push everything else over.
    std::move_backward(I, this->end()-1, this->end());
    this->set_size(this->size() + 1);

    // If we just moved the element we're inserting, be sure to update
    // the reference.
    T *EltPtr = &Elt;
    if (I <= EltPtr && EltPtr < this->end())
      ++EltPtr;

    *I = ::std::move(*EltPtr);
    return I;
  }